

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglInfoTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::QueryStringCase::iterate(QueryStringCase *this)

{
  char *__s;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  allocator<char> local_1d1;
  string local_1d0;
  MessageBuilder local_1a0;
  char *local_20;
  char *result;
  Library *egl;
  QueryStringCase *this_local;
  
  egl = (Library *)this;
  result = (char *)EglTestContext::getLibrary((this->super_InfoCase).super_TestCase.m_eglTestCtx);
  iVar1 = (*((Library *)result)->_vptr_Library[0x2a])
                    (result,(this->super_InfoCase).m_display,(ulong)(uint)this->m_query);
  local_20 = (char *)CONCAT44(extraout_var,iVar1);
  err = (**(code **)(*(long *)result + 0xf8))();
  eglu::checkError(err,"eglQueryString() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglInfoTests.cpp"
                   ,0x7f);
  this_00 = tcu::TestContext::getLog
                      ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
                      );
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_1a0,&local_20);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  tcu::TestContext::setTestResult
            ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  __s = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,__s,&local_1d1);
  validateString(this,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		const char*		result	= egl.queryString(m_display, m_query);
		EGLU_CHECK_MSG(egl, "eglQueryString() failed");

		m_testCtx.getLog() << tcu::TestLog::Message << result << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		validateString(result);

		return STOP;
	}